

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest5::getTessellationControlShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest5 *this,
          bool include_invalid_subroutine_uniform_declaration)

{
  stringstream local_1a8 [8];
  stringstream result_sstream;
  ostream local_198;
  byte local_19;
  NegativeTest5 *pNStack_18;
  bool include_invalid_subroutine_uniform_declaration_local;
  NegativeTest5 *this_local;
  
  local_19 = include_invalid_subroutine_uniform_declaration;
  pNStack_18 = this;
  this_local = (NegativeTest5 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(&local_198,
                  "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout (vertices = 4) out;\n\n"
                 );
  if ((local_19 & 1) != 0) {
    std::operator<<(&local_198,
                    "subroutine void subroutineTestTypeTC(out vec4 test);\n\nsubroutine uniform subroutineTestTypeTC test_subroutineTC;\n"
                   );
  }
  std::operator<<(&local_198,"\nvoid main()\n{\n");
  if ((local_19 & 1) == 0) {
    std::operator<<(&local_198,"    gl_out[gl_InvocationID].gl_Position = vec4(0, 1, 2, 3);\n");
  }
  else {
    std::operator<<(&local_198,"    test_subroutineTC(gl_out[gl_InvocationID].gl_Position);\n");
  }
  std::operator<<(&local_198,"}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest5::getTessellationControlShaderBody(bool include_invalid_subroutine_uniform_declaration) const
{
	std::stringstream result_sstream;

	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n"
					  "layout (vertices = 4) out;\n"
					  "\n";

	if (include_invalid_subroutine_uniform_declaration)
	{
		result_sstream << "subroutine void subroutineTestTypeTC(out vec4 test);\n"
						  "\n"
						  "subroutine uniform subroutineTestTypeTC test_subroutineTC;\n";
	};

	result_sstream << "\n"
					  "void main()\n"
					  "{\n";

	if (include_invalid_subroutine_uniform_declaration)
	{
		result_sstream << "    test_subroutineTC(gl_out[gl_InvocationID].gl_Position);\n";
	}
	else
	{
		result_sstream << "    gl_out[gl_InvocationID].gl_Position = vec4(0, 1, 2, 3);\n";
	}

	result_sstream << "}\n";

	return result_sstream.str();
}